

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederateManager::registerInput
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  string_view typeName;
  Input *pIVar1;
  reference pvVar2;
  RegistrationFailure *this_00;
  char *pcVar3;
  size_t sVar4;
  string_view searchValue1;
  string_view message;
  _Optional_base<unsigned_long,_true,_true> _Var5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_78;
  InterfaceHandle coreID;
  string_view key_local;
  handle datHandle;
  string_view local_48;
  handle inpHandle;
  
  pcVar3 = key._M_str;
  sVar4 = key._M_len;
  key_local._M_len = sVar4;
  key_local._M_str = pcVar3;
  if (this->useJsonSerialization == false) {
    typeName._M_len._4_4_ = in_stack_ffffffffffffff84;
    typeName._M_len._0_4_ = in_stack_ffffffffffffff80;
    typeName._M_str._0_4_ = uStack_78;
    typeName._M_str._4_4_ = coreID.hid;
    local_48 = getCleanedTypeName(typeName);
  }
  else {
    local_48._M_str = "json";
    local_48._M_len = 4;
  }
  coreID.hid = (*this->coreObject->_vptr_Core[0x26])
                         (this->coreObject,(ulong)(uint)(this->fedID).fid,sVar4,pcVar3,
                          local_48._M_len,local_48._M_str,
                          CONCAT44(units._M_len._4_4_,(undefined4)units._M_len),units._M_str._0_4_);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&inpHandle,&this->inputs);
  if (key_local._M_len == 0) {
    _Var5._M_payload.super__Optional_payload_base<unsigned_long> =
         (_Optional_payload<unsigned_long,_true,_true,_true>)
         gmlc::containers::
         DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
         insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                   ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
                     *)inpHandle.data,&coreID,&this->fed,&coreID,&key_local,&units);
  }
  else {
    searchValue1._M_str = key_local._M_str;
    searchValue1._M_len = key_local._M_len;
    _Var5._M_payload.super__Optional_payload_base<unsigned_long> =
         (_Optional_payload<unsigned_long,_true,_true,_true>)
         gmlc::containers::
         DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
         insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                   ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
                     *)inpHandle.data,searchValue1,&coreID,&this->fed,&coreID,&key_local,&units);
  }
  if (((undefined1  [16])_Var5._M_payload.super__Optional_payload_base<unsigned_long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pIVar1 = gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>
             ::back(&(inpHandle.data)->dataStorage);
    gmlc::libguarded::
    shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
    ::lock(&datHandle,&this->inputData);
    pvVar2 = std::deque<helics::InputData,std::allocator<helics::InputData>>::
             emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                       ((deque<helics::InputData,std::allocator<helics::InputData>> *)datHandle.data
                        ,&key_local,&local_48,&units);
    pIVar1->dataReference = pvVar2;
    gmlc::libguarded::
    lock_handle<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
    ::unlock(&datHandle);
    pIVar1->referenceIndex =
         _Var5._M_payload.super__Optional_payload_base<unsigned_long>._M_payload._0_4_;
    if (this->useJsonSerialization == true) {
      pIVar1->targetType = HELICS_JSON;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&datHandle.m_handle_lock);
    std::unique_lock<std::mutex>::~unique_lock(&inpHandle.m_handle_lock);
    return pIVar1;
  }
  this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Input";
  message._M_len = 0x18;
  RegistrationFailure::RegistrationFailure(this_00,message);
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Input& ValueFederateManager::registerInput(std::string_view key,
                                           std::string_view type,
                                           std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerInput(fedID, key, type, units);
    auto inpHandle = inputs.lock();
    decltype(inpHandle->insert(key, coreID, fed, coreID, key, units)) active;
    if (!key.empty()) {
        active = inpHandle->insert(key, coreID, fed, coreID, key, units);
    } else {
        active = inpHandle->insert(no_search, coreID, fed, coreID, key, units);
    }
    if (active) {
        auto& ref = inpHandle->back();
        auto datHandle = inputData.lock();
        auto& idat = datHandle->emplace_back(key, type, units);

        // non-owning pointer
        ref.dataReference = &idat;
        datHandle.unlock();
        ref.referenceIndex = static_cast<int>(*active);
        if (useJsonSerialization) {
            ref.targetType = DataType::HELICS_JSON;
        }
        return ref;
    }
    throw(RegistrationFailure("Unable to register Input"));
}